

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::root_path(path *__return_storage_ptr__,path *this)

{
  path local_c8;
  string local_a8;
  path local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  path *local_18;
  path *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  root_name(&local_78,this);
  string_abi_cxx11_(&local_58,&local_78);
  root_directory(&local_c8,this);
  string_abi_cxx11_(&local_a8,&local_c8);
  std::operator+(&local_38,&local_58,&local_a8);
  path(__return_storage_ptr__,&local_38,native_format);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_a8);
  ~path(&local_c8);
  std::__cxx11::string::~string((string *)&local_58);
  ~path(&local_78);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_path() const
{
    return path(root_name().string() + root_directory().string(), native_format);
}